

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_joy.cpp
# Opt level: O2

double Joy_RemoveDeadZone(double axisval,double deadzone,BYTE *buttons)

{
  BYTE BVar1;
  double dVar2;
  
  if (deadzone <= ABS(axisval)) {
    if (0.0 <= axisval) {
      dVar2 = (axisval - deadzone) / (1.0 - deadzone);
      BVar1 = '\x01';
    }
    else {
      dVar2 = (axisval + deadzone) / (1.0 - deadzone);
      BVar1 = '\x02';
    }
  }
  else {
    dVar2 = 0.0;
    BVar1 = '\0';
  }
  if (buttons != (BYTE *)0x0) {
    *buttons = BVar1;
  }
  return dVar2;
}

Assistant:

double Joy_RemoveDeadZone(double axisval, double deadzone, BYTE *buttons)
{
	BYTE butt;

	// Cancel out deadzone.
	if (fabs(axisval) < deadzone)
	{
		axisval = 0;
		butt = 0;
	}
	// Make the dead zone the new 0.
	else if (axisval < 0)
	{
		axisval = (axisval + deadzone) / (1.0 - deadzone);
		butt = 2;	// button minus
	}
	else
	{
		axisval = (axisval - deadzone) / (1.0 - deadzone);
		butt = 1;	// button plus
	}
	if (buttons != NULL)
	{
		*buttons = butt;
	}
	return axisval;
}